

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

void __thiscall Fl_Input_::minimal_update(Fl_Input_ *this,int p)

{
  byte bVar1;
  int p_local;
  Fl_Input_ *this_local;
  
  bVar1 = Fl_Widget::damage(&this->super_Fl_Widget);
  if ((bVar1 & 0x80) == 0) {
    bVar1 = Fl_Widget::damage(&this->super_Fl_Widget);
    if ((bVar1 & 2) == 0) {
      this->mu_p = p;
    }
    else if (p < this->mu_p) {
      this->mu_p = p;
    }
    Fl_Widget::damage(&this->super_Fl_Widget,'\x02');
    this->erase_cursor_only = '\0';
  }
  return;
}

Assistant:

void Fl_Input_::minimal_update(int p) {
  if (damage() & FL_DAMAGE_ALL) return; // don't waste time if it won't be done
  if (damage() & FL_DAMAGE_EXPOSE) {
    if (p < mu_p) mu_p = p;
  } else {
    mu_p = p;
  }

  damage(FL_DAMAGE_EXPOSE);
  erase_cursor_only = 0;
}